

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void container_free(container_t *c,uint8_t type)

{
  undefined7 in_register_00000031;
  
  switch((int)CONCAT71(in_register_00000031,type)) {
  case 1:
    bitset_container_free((bitset_container_t *)c);
    return;
  case 2:
    array_container_free((array_container_t *)c);
    return;
  case 3:
    run_container_free((run_container_t *)c);
    return;
  case 4:
    shared_container_free((shared_container_t *)c);
    return;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x2cae,"void container_free(container_t *, uint8_t)");
  }
}

Assistant:

void container_free(container_t *c, uint8_t type) {
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_free(CAST_bitset(c));
            break;
        case ARRAY_CONTAINER_TYPE:
            array_container_free(CAST_array(c));
            break;
        case RUN_CONTAINER_TYPE:
            run_container_free(CAST_run(c));
            break;
        case SHARED_CONTAINER_TYPE:
            shared_container_free(CAST_shared(c));
            break;
        default:
            assert(false);
            __builtin_unreachable();
    }
}